

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O2

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::find(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
       *this,RBPath *path,K value)

{
  bool bVar1;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar2;
  bool bVar3;
  
  if (*(path->path)._M_elems[path->length - 1].node.ptr.val < 2) {
    bVar3 = false;
  }
  else {
    do {
      pFVar2 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)(*(path->path)._M_elems[path->length - 1].node.ptr.val & 0xfffffffffffffffe);
      bVar3 = pFVar2 == value.unsafe_capptr;
      if (bVar3) {
        return bVar3;
      }
      bVar1 = RBPath::move_inc_null(path,value.unsafe_capptr <= pFVar2 && !bVar3);
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

ChildRef ith(size_t n)
      {
        SNMALLOC_ASSERT(length >= n);
        return path[length - n - 1].node;
      }